

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrusive-list.h
# Opt level: O3

ssize_t __thiscall
wabt::intrusive_list<wabt::Expr>::splice
          (intrusive_list<wabt::Expr> *this,int __fdin,__off64_t *__offin,int __fdout,
          __off64_t *__offout,size_t __len,uint __flags)

{
  char *pcVar1;
  Expr *pEVar2;
  Expr *pEVar3;
  int iVar4;
  intrusive_list<wabt::Expr> *piVar5;
  undefined4 extraout_var;
  undefined4 in_register_0000000c;
  intrusive_list_base<wabt::Expr> *piVar6;
  intrusive_list_base<wabt::Expr> *piVar7;
  undefined4 in_register_00000034;
  iterator pos;
  iterator iVar8;
  undefined4 in_stack_0000000c;
  Expr *in_stack_00000010;
  _Head_base<0UL,_wabt::Expr_*,_false> local_38;
  
  pos.list_._4_4_ = in_register_00000034;
  pos.list_._0_4_ = __fdin;
  piVar6 = (intrusive_list_base<wabt::Expr> *)CONCAT44(in_register_0000000c,__fdout);
  if ((__off64_t *)CONCAT44(in_stack_0000000c,__flags) != __offout) {
LAB_00f65191:
    __assert_fail("list_ == rhs.list_",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/intrusive-list.h"
                  ,0xc1,
                  "bool wabt::intrusive_list<wabt::Expr>::iterator::operator!=(iterator) const [T = wabt::Expr]"
                 );
  }
  piVar5 = (intrusive_list<wabt::Expr> *)&__flags;
  if (in_stack_00000010 != (Expr *)__len) {
    do {
      if ((Expr *)__len == (Expr *)0x0) {
        __assert_fail("node_",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/intrusive-list.h"
                      ,0xa5,
                      "iterator &wabt::intrusive_list<wabt::Expr>::iterator::operator++() [T = wabt::Expr]"
                     );
      }
      pcVar1 = (((Location *)(piVar6 + 1))->filename).data_;
      if (pcVar1 == (char *)0x0) {
        __assert_fail("!empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/wabt/src/intrusive-list.h"
                      ,0x223,
                      "std::unique_ptr<T> wabt::intrusive_list<wabt::Expr>::extract(iterator) [T = wabt::Expr]"
                     );
      }
      if ((intrusive_list_base<wabt::Expr> *)__offout != piVar6) goto LAB_00f65191;
      pEVar2 = (((Expr *)__len)->super_intrusive_list_base<wabt::Expr>).next_;
      if (piVar6->next_ == piVar6->prev_) {
        piVar6->next_ = (Expr *)0x0;
        piVar6->prev_ = (Expr *)0x0;
      }
      else {
        pEVar3 = (((Expr *)__len)->super_intrusive_list_base<wabt::Expr>).prev_;
        piVar7 = &pEVar3->super_intrusive_list_base<wabt::Expr>;
        if (pEVar3 == (Expr *)0x0) {
          piVar7 = piVar6;
        }
        piVar7->next_ = pEVar2;
        if (pEVar2 == (Expr *)0x0) {
          piVar6->prev_ = pEVar3;
        }
        else {
          (pEVar2->super_intrusive_list_base<wabt::Expr>).prev_ = pEVar3;
        }
      }
      (((Expr *)__len)->super_intrusive_list_base<wabt::Expr>).next_ = (Expr *)0x0;
      (((Expr *)__len)->super_intrusive_list_base<wabt::Expr>).prev_ = (Expr *)0x0;
      (((Location *)(piVar6 + 1))->filename).data_ = pcVar1 + -1;
      pos.node_ = (Expr *)__offin;
      local_38._M_head_impl = (Expr *)__len;
      iVar8 = insert(this,pos,(unique_ptr<wabt::Expr,_std::default_delete<wabt::Expr>_> *)&local_38)
      ;
      piVar5 = iVar8.list_;
      if (local_38._M_head_impl != (Expr *)0x0) {
        iVar4 = (*(local_38._M_head_impl)->_vptr_Expr[1])();
        piVar5 = (intrusive_list<wabt::Expr> *)CONCAT44(extraout_var,iVar4);
      }
      local_38._M_head_impl = (Expr *)0x0;
      __len = (size_t)pEVar2;
    } while (pEVar2 != in_stack_00000010);
  }
  return (ssize_t)piVar5;
}

Assistant:

inline void intrusive_list<T>::splice(iterator pos,
                                      intrusive_list& other,
                                      iterator first,
                                      iterator last) {
  while (first != last)
    insert(pos, other.extract(first++));
}